

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

AndConstraint * __thiscall icu_63::AndConstraint::add(AndConstraint *this,UErrorCode *status)

{
  AndConstraint *pAVar1;
  
  if (this->fInternalStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    pAVar1 = (AndConstraint *)UMemory::operator_new((UMemory *)0x38,(size_t)status);
    if (pAVar1 != (AndConstraint *)0x0) {
      *(undefined8 *)&pAVar1->value = 0;
      pAVar1->rangeList = (UVector32 *)0x0;
      pAVar1->negated = '\0';
      pAVar1->integerOnly = '\0';
      *(undefined2 *)&pAVar1->field_0x22 = 0;
      pAVar1->digitsType = none;
      pAVar1->next = (AndConstraint *)0x0;
      *(undefined8 *)&pAVar1->fInternalStatus = 0;
      pAVar1->_vptr_AndConstraint = (_func_int **)&PTR__AndConstraint_00477fa8;
      pAVar1->op = NONE;
      pAVar1->opNum = -1;
      pAVar1->value = -1;
      pAVar1->negated = '\0';
      *(undefined8 *)&pAVar1->digitsType = 0;
      *(undefined8 *)((long)&pAVar1->next + 4) = 0;
      this->next = pAVar1;
      return pAVar1;
    }
    this->next = (AndConstraint *)0x0;
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    *status = this->fInternalStatus;
  }
  return (AndConstraint *)0x0;
}

Assistant:

AndConstraint*
AndConstraint::add(UErrorCode& status) {
    if (U_FAILURE(fInternalStatus)) {
        status = fInternalStatus;
        return nullptr;
    }
    this->next = new AndConstraint();
    if (this->next == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    return this->next;
}